

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  int iVar2;
  FuncState *pFVar3;
  lua_State *L;
  Proto *pPVar4;
  bool bVar5;
  int iVar6;
  Proto **ppPVar7;
  TString *pTVar8;
  long lVar9;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_90;
  FuncState local_78;
  
  pFVar3 = ls->fs;
  L = ls->L;
  pPVar4 = pFVar3->f;
  iVar6 = pPVar4->sizep;
  lVar9 = (long)iVar6;
  if (iVar6 <= pFVar3->np) {
    ppPVar7 = (Proto **)luaM_growaux_(L,pPVar4->p,pFVar3->np,&pPVar4->sizep,8,0x1ffff,"functions");
    pPVar4->p = ppPVar7;
    iVar2 = pPVar4->sizep;
    if (iVar6 < iVar2) {
      do {
        pPVar4->p[lVar9] = (Proto *)0x0;
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
  }
  local_78.f = luaF_newproto(L);
  ppPVar7 = pPVar4->p;
  iVar6 = pFVar3->np;
  pFVar3->np = iVar6 + 1;
  ppPVar7[iVar6] = local_78.f;
  if (((pPVar4->marked & 0x20) != 0) && (((local_78.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)pPVar4,(GCObject *)local_78.f);
  }
  (local_78.f)->linedefined = line;
  open_func(ls,&local_78,&local_90);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar8 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar8);
    adjustlocalvars(ls,1);
  }
  pFVar3 = ls->fs;
  pPVar4 = pFVar3->f;
  if ((ls->t).token == 0x29) {
    bVar5 = true;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    while( true ) {
      iVar2 = (ls->t).token;
      if (iVar2 == 0x118) {
        luaX_next(ls);
        bVar5 = false;
      }
      else {
        if (iVar2 != 0x123) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        pTVar8 = str_checkname(ls);
        new_localvar(ls,pTVar8);
        iVar6 = iVar6 + 1;
        bVar5 = true;
      }
      if ((!bVar5) || ((ls->t).token != 0x2c)) break;
      luaX_next(ls);
    }
  }
  adjustlocalvars(ls,iVar6);
  bVar1 = pFVar3->nactvar;
  pPVar4->numparams = bVar1;
  if (!bVar5) {
    pFVar3->f->is_vararg = '\x01';
    luaK_codeABCk(pFVar3,OP_VARARGPREP,(uint)bVar1,0,0,0);
  }
  luaK_reserveregs(pFVar3,(uint)pFVar3->nactvar);
  checknext(ls,0x29);
  statlist(ls);
  (local_78.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  pFVar3 = ls->fs->prev;
  iVar6 = luaK_codeABx(pFVar3,OP_CLOSURE,0,pFVar3->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOC;
  (e->u).info = iVar6;
  luaK_exp2nextreg(pFVar3,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}